

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

void BinaryenAtomicNotifySetNotifyCount
               (BinaryenExpressionRef expr,BinaryenExpressionRef notifyCountExpr)

{
  if (expr->_id != AtomicNotifyId) {
    __assert_fail("expression->is<AtomicNotify>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xc39,
                  "void BinaryenAtomicNotifySetNotifyCount(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (notifyCountExpr != (BinaryenExpressionRef)0x0) {
    *(BinaryenExpressionRef *)(expr + 2) = notifyCountExpr;
    return;
  }
  __assert_fail("notifyCountExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xc3a,
                "void BinaryenAtomicNotifySetNotifyCount(BinaryenExpressionRef, BinaryenExpressionRef)"
               );
}

Assistant:

void BinaryenAtomicNotifySetNotifyCount(BinaryenExpressionRef expr,
                                        BinaryenExpressionRef notifyCountExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<AtomicNotify>());
  assert(notifyCountExpr);
  static_cast<AtomicNotify*>(expression)->notifyCount =
    (Expression*)notifyCountExpr;
}